

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::globalError(Federate *this,int errorcode)

{
  string_view message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __sv_type _Var1;
  string errorString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int errorcode_00;
  char *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff7c;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff70;
  CLI::std::__cxx11::to_string(in_stack_ffffffffffffff7c);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  errorcode_00 = (int)((ulong)__lhs >> 0x20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  _Var1 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  message._M_str = in_stack_ffffffffffffff60;
  message._M_len = (size_t)_Var1._M_str;
  globalError((Federate *)_Var1._M_len,errorcode_00,message);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return;
}

Assistant:

void Federate::globalError(int errorcode)
{
    const std::string errorString =
        "global error " + std::to_string(errorcode) + " in federate " + mName;
    globalError(errorcode, errorString);
}